

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# launchByAssociation.h
# Opt level: O0

int util::launchByAssociation(string *location)

{
  int iVar1;
  ostream *poVar2;
  char *__command;
  string *in_RDI;
  ostringstream cmd;
  string local_1b8 [24];
  allocator<char> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  allocator<char> local_9;
  string *local_8;
  
  local_8 = in_RDI;
  if (launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&launchByAssociation(std::__cxx11::string_const&)::
                                 LAUNCH_CMD_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      std::allocator<char>::~allocator(&local_9);
      __cxa_atexit(std::__cxx11::string::~string,
                   &launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe68);
  poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe68,
                           (string *)
                           &launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_)
  ;
  std::operator<<(poVar2,local_8);
  std::__cxx11::ostringstream::str();
  __command = (char *)std::__cxx11::string::c_str();
  iVar1 = system(__command);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe68);
  return iVar1;
}

Assistant:

int launchByAssociation(std::string const& location) {
#if defined(_WIN32)
		static const std::string LAUNCH_CMD = "start \"launchByAssociation\" ";
#elif defined(__APPLE__)
		static const std::string LAUNCH_CMD = "open ";
#else
		// Assume we're on a freedesktop.org system with xdg-utils
		static const std::string LAUNCH_CMD = "xdg-open ";
#endif
		std::ostringstream cmd;
		cmd << LAUNCH_CMD << location;
		return system(cmd.str().c_str());
	}